

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O0

int Acb_NtkCountRoots(Vec_Int_t *vWinObjs,int PivotVar)

{
  int iVar1;
  undefined4 local_20;
  int nRoots;
  int iObjLit;
  int i;
  int PivotVar_local;
  Vec_Int_t *vWinObjs_local;
  
  local_20 = 0;
  for (nRoots = PivotVar + 1; iVar1 = Vec_IntSize(vWinObjs), nRoots < iVar1; nRoots = nRoots + 1) {
    iVar1 = Vec_IntEntry(vWinObjs,nRoots);
    iVar1 = Abc_LitIsCompl(iVar1);
    local_20 = iVar1 + local_20;
  }
  return local_20;
}

Assistant:

int Acb_NtkCountRoots( Vec_Int_t * vWinObjs, int PivotVar )
{
    int i, iObjLit, nRoots = 0;
    Vec_IntForEachEntryStart( vWinObjs, iObjLit, i, PivotVar + 1 )
        nRoots += Abc_LitIsCompl(iObjLit);
    return nRoots;
}